

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFront.c
# Opt level: O0

int Gia_ManCrossCutSimple(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_24;
  int local_20;
  int nCutMax;
  int nCutCur;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_20 = 0;
  local_24 = 0;
  Gia_ManCreateValueRefs(p);
  nCutMax = 0;
  while( true ) {
    bVar4 = false;
    if (nCutMax < p->nObjs) {
      _nCutCur = Gia_ManObj(p,nCutMax);
      bVar4 = _nCutCur != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    if (_nCutCur->Value != 0) {
      local_20 = local_20 + 1;
    }
    if (local_24 < local_20) {
      local_24 = local_20;
    }
    iVar1 = Gia_ObjIsAnd(_nCutCur);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(_nCutCur);
      if (iVar1 != 0) {
        pGVar3 = Gia_ObjFanin0(_nCutCur);
        uVar2 = pGVar3->Value - 1;
        pGVar3->Value = uVar2;
        if (uVar2 == 0) {
          local_20 = local_20 + -1;
        }
      }
    }
    else {
      pGVar3 = Gia_ObjFanin0(_nCutCur);
      uVar2 = pGVar3->Value - 1;
      pGVar3->Value = uVar2;
      if (uVar2 == 0) {
        local_20 = local_20 + -1;
      }
      pGVar3 = Gia_ObjFanin1(_nCutCur);
      uVar2 = pGVar3->Value - 1;
      pGVar3->Value = uVar2;
      if (uVar2 == 0) {
        local_20 = local_20 + -1;
      }
    }
    nCutMax = nCutMax + 1;
  }
  return local_24;
}

Assistant:

int Gia_ManCrossCutSimple( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nCutCur = 0, nCutMax = 0;
    Gia_ManCreateValueRefs( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( pObj->Value )
            nCutCur++;
        if ( nCutMax < nCutCur )
            nCutMax = nCutCur;
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
            if ( --Gia_ObjFanin1(pObj)->Value == 0 )
                nCutCur--;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
                nCutCur--;
        }
    }
//    Gia_ManForEachObj( p, pObj, i )
//        assert( pObj->Value == 0 );
    return nCutMax;
}